

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

Image * operator-(Image *__return_storage_ptr__,Image *image1,Image *image2)

{
  int row;
  int col;
  int iVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  int **ppiVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  Image result;
  Image local_48;
  
  row = image1->row;
  col = image1->col;
  iVar1 = image1->maxGray;
  local_48.row = row;
  local_48.col = col;
  local_48.maxGray = iVar1;
  ppiVar5 = clone_matrix<int>(image1->matrix,row,col);
  iVar8 = image1->row;
  if (0 < iVar8) {
    ppiVar2 = image2->matrix;
    uVar7 = (ulong)(uint)image1->col;
    lVar6 = 0;
    do {
      if (0 < (int)uVar7) {
        piVar3 = ppiVar2[lVar6];
        piVar4 = ppiVar5[lVar6];
        lVar9 = 0;
        do {
          piVar4[lVar9] = piVar4[lVar9] - piVar3[lVar9];
          lVar9 = lVar9 + 1;
          uVar7 = (ulong)image1->col;
        } while (lVar9 < (long)uVar7);
        iVar8 = image1->row;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar8);
  }
  local_48.matrix = ppiVar5;
  Image::normalize(&local_48);
  __return_storage_ptr__->row = row;
  __return_storage_ptr__->col = col;
  __return_storage_ptr__->maxGray = iVar1;
  ppiVar5 = clone_matrix<int>(ppiVar5,row,col);
  __return_storage_ptr__->matrix = ppiVar5;
  free_matrix<int>(local_48.matrix,local_48.row);
  return __return_storage_ptr__;
}

Assistant:

Image operator-(Image& image1, Image& image2)
{
    Image result = image1.clone();

    for (int i = 0; i < image1.row; ++i) {
        for (int j = 0; j < image1.col; ++j) {
            result.matrix[i][j] -= image2.matrix[i][j];
        }
    }

    return result.normalize();
}